

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

bool __thiscall QHttp2Connection::serverCheckClientPreface(QHttp2Connection *this)

{
  bool bVar1;
  QIODevice *pQVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_40;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if (this[0x2b1] != (QHttp2Connection)0x1) goto LAB_001d7361;
  pQVar2 = getSocket(this);
  lVar3 = (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2);
  if (0x17 < lVar3) {
    bVar1 = readClientPreface(this);
    if (bVar1) {
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_40.d._0_4_ = 2;
        local_40._4_8_ = 0;
        local_40._12_8_ = 0;
        local_40.size._4_4_ = 0;
        local_28 = qHttp2ConnectionLog::category.name;
        QMessageLogger::debug((char *)&local_40,"[%p] Peer sent valid client preface",this);
      }
      this[0x2b1] = (QHttp2Connection)0x0;
      bVar1 = sendServerPreface(this);
      if (bVar1) goto LAB_001d7361;
      connectionError(this,INTERNAL_ERROR,"Failed to send server preface");
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x70))(pQVar2);
      latin1.m_data = "invalid client preface";
      latin1.m_size = 0x16;
      QString::QString((QString *)&local_40,latin1);
      errorOccurred(this,PROTOCOL_ERROR,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_40.d._0_4_ = 2;
        local_40._4_8_ = 0;
        local_40._12_8_ = 0;
        local_40.size._4_4_ = 0;
        local_28 = qHttp2ConnectionLog::category.name;
        bVar4 = false;
        QMessageLogger::debug((char *)&local_40,"[%p] Invalid client preface",this);
        goto LAB_001d7361;
      }
    }
  }
  bVar4 = false;
LAB_001d7361:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::serverCheckClientPreface()
{
    if (!m_waitingForClientPreface)
        return true;
    auto *socket = getSocket();
    if (socket->bytesAvailable() < Http2::clientPrefaceLength)
        return false;
    if (!readClientPreface()) {
        socket->close();
        emit errorOccurred(Http2Error::PROTOCOL_ERROR, "invalid client preface"_L1);
        qCDebug(qHttp2ConnectionLog, "[%p] Invalid client preface", this);
        return false;
    }
    qCDebug(qHttp2ConnectionLog, "[%p] Peer sent valid client preface", this);
    m_waitingForClientPreface = false;
    if (!sendServerPreface()) {
        connectionError(INTERNAL_ERROR, "Failed to send server preface");
        return false;
    }
    return true;
}